

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O1

void __thiscall Api::initFromFile(Api *this,string string)

{
  EventHandler *e;
  uint uVar1;
  AEntity *pAVar2;
  Minion *pMVar3;
  Player *pPVar4;
  Weapon *pWVar5;
  int iVar6;
  
  e = &this->_event;
  iVar6 = 0x1e;
  do {
    uVar1 = rand();
    pAVar2 = (AEntity *)operator_new(0x30);
    if ((uVar1 & 1) == 0) {
      pMVar3 = (Minion *)operator_new(0xb0);
      Minion1::Minion1((Minion1 *)pMVar3,e);
      AEntity::AEntity(pAVar2,pMVar3);
    }
    else {
      pWVar5 = (Weapon *)operator_new(0xa0);
      Weapon1::Weapon1((Weapon1 *)pWVar5,e);
      AEntity::AEntity(pAVar2,pWVar5);
    }
    pPVar4 = GameManager::get_player(&this->_game);
    Player::addCard(pPVar4,pAVar2);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  iVar6 = 0x1e;
  do {
    uVar1 = rand();
    pAVar2 = (AEntity *)operator_new(0x30);
    if ((uVar1 & 1) == 0) {
      pMVar3 = (Minion *)operator_new(0xb0);
      Minion1::Minion1((Minion1 *)pMVar3,e);
      AEntity::AEntity(pAVar2,pMVar3);
    }
    else {
      pWVar5 = (Weapon *)operator_new(0xa0);
      Weapon1::Weapon1((Weapon1 *)pWVar5,e);
      AEntity::AEntity(pAVar2,pWVar5);
    }
    pPVar4 = GameManager::get_player(&this->_game);
    Player::addCard(pPVar4 + 1,pAVar2);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  return;
}

Assistant:

void Api::initFromFile(std::string string) {
    // TODO: generate players deck from file
    // tmp generation deck from exemple class weapon1 and minion1
    for (int i = 0; i < 30; ++i) {
        if (rand() % 2) {
            this->addCardToPlayer(0, new AEntity(new Weapon1(_event)));
        } else {
            this->addCardToPlayer(0, new AEntity(new Minion1(_event)));
        }
    }
    for (int i = 0; i < 30; ++i) {
        if (rand() % 2) {
            this->addCardToPlayer(1, new AEntity(new Weapon1(_event)));
        } else {
            this->addCardToPlayer(1, new AEntity(new Minion1(_event)));
        }
    }
}